

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_28(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<LNode> sVar1;
  LNodeChildren local_48;
  undefined1 local_2c [28];
  LParser *this_local;
  
  local_2c._0_4_ = 0x2f;
  local_48.children.
  super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.children.
  super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.children.
  super__Vector_base<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_local = this;
  LNodeChildren::LNodeChildren(&local_48);
  std::make_shared<LNodeData<LNodeChildren>,LNodeType,LNodeChildren>
            ((LNodeType *)(local_2c + 4),(LNodeChildren *)local_2c);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<LNodeChildren>,void>
            ((shared_ptr<LNode> *)this,(shared_ptr<LNodeData<LNodeChildren>_> *)(local_2c + 4));
  std::shared_ptr<LNodeData<LNodeChildren>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeChildren>_> *)(local_2c + 4));
  LNodeChildren::~LNodeChildren(&local_48);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_28() {
    // FCalls : 
    return std::make_shared<LNodeData<LNodeChildren>>(LNodeType::FCalls, LNodeChildren());
}